

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_matcher.cxx
# Opt level: O3

WithinAbsMatcher *
IntegratorXX::Matchers::WithinAbs
          (WithinAbsMatcher *__return_storage_ptr__,string *msg,double target,double margin)

{
  pointer pcVar1;
  string local_38;
  
  pcVar1 = (msg->_M_dataplus)._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + msg->_M_string_length);
  WithinAbsMatcher::WithinAbsMatcher(__return_storage_ptr__,&local_38,target,margin);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

WithinAbsMatcher WithinAbs(std::string msg, double target, double margin) {
    return WithinAbsMatcher(msg, target, margin);
}